

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

ON_OBSOLETE_V5_HatchExtra * ON_OBSOLETE_V5_HatchExtra::HatchExtension(ON_Hatch *pHatch)

{
  bool bVar1;
  ON_UserData *p;
  ON_OBSOLETE_V5_HatchExtra *this;
  ON_UUID local_28;
  ON_OBSOLETE_V5_HatchExtra *local_18;
  ON_OBSOLETE_V5_HatchExtra *pExtra;
  ON_Hatch *pHatch_local;
  
  local_18 = (ON_OBSOLETE_V5_HatchExtra *)0x0;
  if (pHatch != (ON_Hatch *)0x0) {
    pExtra = (ON_OBSOLETE_V5_HatchExtra *)pHatch;
    local_28 = ON_ClassId::Uuid(&m_ON_OBSOLETE_V5_HatchExtra_class_rtti);
    p = ON_Object::GetUserData((ON_Object *)pHatch,&local_28);
    local_18 = Cast(&p->super_ON_Object);
    if (local_18 == (ON_OBSOLETE_V5_HatchExtra *)0x0) {
      this = (ON_OBSOLETE_V5_HatchExtra *)operator_new(0xd8);
      ON_OBSOLETE_V5_HatchExtra(this);
      local_18 = this;
      if ((this != (ON_OBSOLETE_V5_HatchExtra *)0x0) &&
         (bVar1 = ON_Object::AttachUserData((ON_Object *)pExtra,(ON_UserData *)this), !bVar1)) {
        if (local_18 != (ON_OBSOLETE_V5_HatchExtra *)0x0) {
          (*(local_18->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])();
        }
        local_18 = (ON_OBSOLETE_V5_HatchExtra *)0x0;
      }
    }
  }
  return local_18;
}

Assistant:

ON_OBSOLETE_V5_HatchExtra* ON_OBSOLETE_V5_HatchExtra::HatchExtension(const ON_Hatch* pHatch)
{
  ON_OBSOLETE_V5_HatchExtra* pExtra = nullptr;
  if(pHatch)
  {
    pExtra = ON_OBSOLETE_V5_HatchExtra::Cast(pHatch->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_HatchExtra)));
    if(pExtra == nullptr)
    {
      pExtra = new ON_OBSOLETE_V5_HatchExtra;
      if(pExtra)
      {
        if(!const_cast<ON_Hatch*>(pHatch)->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = nullptr;
        }
      }  
    }
  }
  return pExtra;
}